

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____2>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____2> *this)

{
  long *plVar1;
  long in_RDI;
  ____C_A_T_C_H____T_E_S_T____2 obj;
  code *local_150;
  long local_120 [36];
  
  anon_unknown.dwarf_9d1c3::____C_A_T_C_H____T_E_S_T____2::____C_A_T_C_H____T_E_S_T____2
            ((____C_A_T_C_H____T_E_S_T____2 *)0x27eeb6);
  local_150 = *(code **)(in_RDI + 8);
  plVar1 = (long *)((long)local_120 + *(long *)(in_RDI + 0x10));
  if (((ulong)local_150 & 1) != 0) {
    local_150 = *(code **)(local_150 + *plVar1 + -1);
  }
  (*local_150)(plVar1);
  anon_unknown.dwarf_9d1c3::____C_A_T_C_H____T_E_S_T____2::~____C_A_T_C_H____T_E_S_T____2
            ((____C_A_T_C_H____T_E_S_T____2 *)0x27ef1d);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }